

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,1,0,1,1>>,Eigen::internal::assign_op<float,float>>
               (Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>
               *src,assign_op<float,_float> *func)

{
  SrcEvaluatorType func_00;
  Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false> *dstExpr;
  undefined1 local_68 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>_>
  local_28;
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>
  *src_local;
  Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false> *dst_local;
  
  srcEvaluator = (SrcEvaluatorType)func;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>_>
  ::evaluator(&local_28,src);
  resize_if_allowed<Eigen::Block<Eigen::Matrix<float,4,1,0,4,1>,1,1,false>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,1,0,1,1>>,float,float>
            (dst,src,(assign_op<float,_float> *)srcEvaluator);
  evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_> *)
             &kernel.m_dstExpr,dst);
  func_00 = srcEvaluator;
  dstExpr = EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_>::
            const_cast_derived((EigenBase<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_>
                                *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_68,(DstEvaluatorType *)&kernel.m_dstExpr,&local_28,
             (assign_op<float,_float> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_3,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_68);
  evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1,_1,_false>_> *)
             &kernel.m_dstExpr);
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_1,_1,_0,_1,_1>_>_>
  ::~evaluator(&local_28);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}